

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day03.cpp
# Opt level: O0

void day03(input_t input)

{
  uint16_t uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  value_type_conflict3 vVar6;
  uint16_t uVar7;
  reference pvVar8;
  reference pvVar9;
  pointer pcVar10;
  reference pvVar11;
  iterator pvVar12;
  long in_RSI;
  char *in_RDI;
  value_type_conflict2 c_1;
  iterator __end2;
  iterator __begin2;
  array<unsigned_long,_17UL> *__range2;
  reverse_iterator vi_1;
  reverse_iterator vi;
  uint16_t y;
  array<unsigned_long,_17UL> collide;
  array<unsigned_long,_17UL> row;
  int part2;
  int part1;
  uint8_t c;
  int i;
  int have;
  int n;
  array<unsigned_short,_5UL> arr;
  vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_> v;
  vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  *in_stack_fffffffffffffcc8;
  array<unsigned_long,_17UL> *in_stack_fffffffffffffcd0;
  __normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>
  in_stack_fffffffffffffcd8;
  __normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>
  in_stack_fffffffffffffce0;
  size_type in_stack_fffffffffffffcf8;
  vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  *in_stack_fffffffffffffd00;
  iterator local_1d8;
  uint local_70;
  uint local_6c;
  int local_54;
  char *local_18;
  long local_10;
  
  std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
  vector((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_> *)
         0x10cd0c);
  std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
  reserve(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  vVar6 = 0;
  bVar4 = false;
  local_54 = 0;
  local_18 = in_RDI;
  local_10 = in_RSI;
  while (local_10 != 0) {
    if ((byte)(*local_18 - 0x30U) < 10) {
      vVar6 = vVar6 * 10 + (ushort)(byte)(*local_18 - 0x30U);
      bVar4 = true;
    }
    else if (bVar4) {
      local_54 = local_54 + 1;
      pvVar8 = std::array<unsigned_short,_5UL>::operator[]
                         ((array<unsigned_short,_5UL> *)in_stack_fffffffffffffcd0,
                          (size_type)in_stack_fffffffffffffcc8);
      *pvVar8 = vVar6;
      if (local_54 == 5) {
        std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>::
        emplace_back<std::array<unsigned_short,5ul>&>
                  ((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                    *)in_stack_fffffffffffffce0._M_current,
                   (array<unsigned_short,_5UL> *)in_stack_fffffffffffffcd8._M_current);
        local_54 = 0;
      }
      bVar4 = false;
      vVar6 = 0;
    }
    local_18 = local_18 + 1;
    local_10 = local_10 + -1;
  }
  std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
  begin(in_stack_fffffffffffffcc8);
  std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::end
            (in_stack_fffffffffffffcc8);
  std::
  sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>>
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_6c = 0;
  local_70 = 0;
  do {
    bVar4 = std::
            vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            ::empty((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                     *)in_stack_fffffffffffffce0._M_current);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n",(ulong)local_6c,(ulong)local_70);
      std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
      ~vector((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
               *)in_stack_fffffffffffffce0._M_current);
      return;
    }
    std::array<unsigned_long,_17UL>::fill
              ((array<unsigned_long,_17UL> *)in_stack_fffffffffffffce0._M_current,
               &(in_stack_fffffffffffffcd8._M_current)->mask0);
    std::array<unsigned_long,_17UL>::fill
              ((array<unsigned_long,_17UL> *)in_stack_fffffffffffffce0._M_current,
               &(in_stack_fffffffffffffcd8._M_current)->mask0);
    pvVar9 = std::
             vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
             ::back((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                     *)in_stack_fffffffffffffcd0);
    uVar1 = pvVar9->y;
    std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
    rbegin((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            *)in_stack_fffffffffffffcd8._M_current);
    while( true ) {
      std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
      rend((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            *)in_stack_fffffffffffffcd8._M_current);
      bVar5 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                               *)in_stack_fffffffffffffcd0,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                               *)in_stack_fffffffffffffcc8);
      bVar4 = false;
      if (bVar5) {
        pcVar10 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                                *)in_stack_fffffffffffffcd0);
        bVar4 = pcVar10->y == uVar1;
      }
      if (!bVar4) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd0);
      pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                          (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      uVar3 = *pvVar11;
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      uVar2 = pcVar10->mask0;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd0);
      pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                          (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      *pvVar11 = *pvVar11 | uVar3 & uVar2;
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      uVar3 = pcVar10->mask0;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd0);
      pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                          (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      *pvVar11 = *pvVar11 | uVar3;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd0);
      pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                          (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      uVar3 = *pvVar11;
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      uVar2 = pcVar10->mask1;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd0);
      pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                          (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      *pvVar11 = *pvVar11 | uVar3 & uVar2;
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      uVar3 = pcVar10->mask1;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd0);
      pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                          (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      *pvVar11 = uVar3 | *pvVar11;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd8._M_current,
                   (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    }
    std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
    rbegin((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            *)in_stack_fffffffffffffcd8._M_current);
    while( true ) {
      std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
      rend((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            *)in_stack_fffffffffffffcd8._M_current);
      bVar5 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                               *)in_stack_fffffffffffffcd0,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                               *)in_stack_fffffffffffffcc8);
      bVar4 = false;
      if (bVar5) {
        pcVar10 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                                *)in_stack_fffffffffffffcd0);
        bVar4 = pcVar10->y == uVar1;
      }
      if (!bVar4) break;
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      if ((pcVar10->part2 & 1U) != 0) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                      *)in_stack_fffffffffffffcd0);
        pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                            (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
        uVar3 = *pvVar11;
        pcVar10 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                                *)in_stack_fffffffffffffcd0);
        if ((uVar3 & pcVar10->mask0) == 0) {
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
          ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                        *)in_stack_fffffffffffffcd0);
          pvVar11 = std::array<unsigned_long,_17UL>::operator[]
                              (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
          uVar3 = *pvVar11;
          pcVar10 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                                  *)in_stack_fffffffffffffcd0);
          if ((uVar3 & pcVar10->mask1) == 0) goto LAB_0010d409;
        }
        pcVar10 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                                *)in_stack_fffffffffffffcd0);
        pcVar10->part2 = false;
      }
LAB_0010d409:
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      pcVar10->y = pcVar10->y + 1;
      pcVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                              *)in_stack_fffffffffffffcd0);
      uVar7 = pcVar10->h - 1;
      pcVar10->h = uVar7;
      if (uVar7 == 0) {
        pcVar10 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                                *)in_stack_fffffffffffffcd0);
        if ((pcVar10->part2 & 1U) != 0) {
          in_stack_fffffffffffffce0._M_current =
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                             *)in_stack_fffffffffffffcd0);
          local_70 = (uint)(in_stack_fffffffffffffce0._M_current)->id;
        }
        in_stack_fffffffffffffcd8._M_current =
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                          *)in_stack_fffffffffffffcd0);
        pvVar9 = std::
                 vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                 ::back((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                         *)in_stack_fffffffffffffcd0);
        std::swap<(anonymous_namespace)::claim_t>(in_stack_fffffffffffffcd8._M_current,pvVar9);
        std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
        ::pop_back((vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                    *)0x10d4d8);
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>_>
                    *)in_stack_fffffffffffffcd8._M_current,
                   (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    }
    local_1d8 = std::array<unsigned_long,_17UL>::begin((array<unsigned_long,_17UL> *)0x10d515);
    pvVar12 = std::array<unsigned_long,_17UL>::end((array<unsigned_long,_17UL> *)0x10d52a);
    for (; local_1d8 != pvVar12; local_1d8 = local_1d8 + 1) {
      in_stack_fffffffffffffcd0 = (array<unsigned_long,_17UL> *)(long)(int)POPCOUNT(*local_1d8);
      local_6c = local_6c + (int)POPCOUNT(*local_1d8);
    }
  } while( true );
}

Assistant:

void day03(input_t input) {
	std::vector<claim_t> v;
	v.reserve(1500);

	std::array<uint16_t, 5> arr;
	for (int n = 0, have = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
			have = 1;
		} else if (have) {
			arr[i++] = n;
			if (i == 5) {
				v.emplace_back(arr);
				i = 0;
			}
			n = have = 0;
		}
	}

	// Sort by starting y-index
	std::sort(v.begin(), v.end());

	int part1 = 0, part2 = 0;

	/* Sweep vertically down the fabric, one row at a time,
	 * checking for collisions between claims.
	 */
	std::array<uint64_t, 17> row, collide;
	while (!v.empty()) {
		row.fill(0);
		collide.fill(0);

		auto y = v.back().y;
		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			collide[vi->idx + 0] |= row[vi->idx + 0] & vi->mask0;
			row[vi->idx + 0] |= vi->mask0;
			collide[vi->idx + 1] |= row[vi->idx + 1] & vi->mask1;
			row[vi->idx + 1] |= vi->mask1;
		}

		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			if (vi->part2) {
				if ((collide[vi->idx + 0] & vi->mask0) ||
				    (collide[vi->idx + 1] & vi->mask1))
				{
					vi->part2 = false;
				}
			}

			vi->y++;
			if (--vi->h == 0) {
				/* Reached the bottom of this claim; check for
				 * part2 solution and remove the claim
				 */
				if (vi->part2) {
					part2 = vi->id;
				}
				std::swap(*vi, v.back());
				v.pop_back();
			}
		}

		// Just tally up the 1-bits for part1
		for (auto c : collide) {
			part1 += _mm_popcnt_u64(c);
		}
	}

	printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n", part1, part2);
}